

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

void __thiscall
boost::runtime::unrecognized_param::unrecognized_param
          (unrecognized_param *this,unrecognized_param *param_1)

{
  specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::
  specific_param_error
            (&this->
              super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
             ,&param_1->
               super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
            );
  *(undefined ***)
   &(this->
    super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>).
    super_input_error.super_param_error = &PTR__unrecognized_param_001e1db8;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::vector(&this->m_typo_candidates,&param_1->m_typo_candidates);
  return;
}

Assistant:

explicit    unrecognized_param( std::vector<cstring>&& type_candidates )
    : specific_param_error<unrecognized_param,input_error>( "" )
    , m_typo_candidates( std::move( type_candidates ) ) {}